

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.c
# Opt level: O0

void oggpack_adv(oggpack_buffer *b,int bits)

{
  uint uVar1;
  int bits_local;
  oggpack_buffer *b_local;
  
  uVar1 = b->endbit + bits;
  if (b->storage - (long)((int)(uVar1 + 7) >> 3) < b->endbyte) {
    b->ptr = (uchar *)0x0;
    b->endbyte = b->storage;
    b->endbit = 1;
  }
  else {
    b->ptr = b->ptr + (int)uVar1 / 8;
    b->endbyte = (long)((int)uVar1 / 8) + b->endbyte;
    b->endbit = uVar1 & 7;
  }
  return;
}

Assistant:

void oggpack_adv(oggpack_buffer *b,int bits){
  bits+=b->endbit;

  if(b->endbyte > b->storage-((bits+7)>>3)) goto overflow;

  b->ptr+=bits/8;
  b->endbyte+=bits/8;
  b->endbit=bits&7;
  return;

 overflow:
  b->ptr=NULL;
  b->endbyte=b->storage;
  b->endbit=1;
}